

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledOutputFile::Data::Data(Data *this,int numThreads)

{
  undefined4 in_ESI;
  V2f *in_RDI;
  V2f *pVVar1;
  V2f *this_00;
  Vec2<float> *this_01;
  LevelMode r;
  float in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  float in_stack_fffffffffffffff0;
  
  this_01 = (Vec2<float> *)&stack0xffffffffffffffec;
  pVVar1 = in_RDI;
  Imath_2_5::Vec2<float>::Vec2(this_01,0.0,0.0);
  r = ONE_LEVEL;
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                 pVVar1,(float)((ulong)this_01 >> 0x20),(LineOrder)this_01,
                 (Compression)((ulong)in_RDI >> 0x20));
  *(undefined1 *)&pVVar1[7].y = 0;
  TileDescription::TileDescription((TileDescription *)(pVVar1 + 8),0x20,0x20,r,r);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x1a1cef);
  in_RDI[0x15].x = 0.0;
  in_RDI[0x15].y = 0.0;
  in_RDI[0x16].x = 0.0;
  in_RDI[0x16].y = 0.0;
  TileOffsets::TileOffsets
            ((TileOffsets *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (LevelMode)in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe4,
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int *)CONCAT44(in_stack_ffffffffffffffd4,r));
  std::
  vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo>_>
            *)0x1a1d3f);
  pVVar1 = in_RDI + 0x21;
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)0x1a1d55);
  in_RDI[0x25].x = 0.0;
  in_RDI[0x25].y = 0.0;
  this_00 = in_RDI + 0x26;
  std::
  map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
  ::map((map<Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*,_std::less<Imf_2_5::(anonymous_namespace)::TileCoord>,_std::allocator<std::pair<const_Imf_2_5::(anonymous_namespace)::TileCoord,_Imf_2_5::(anonymous_namespace)::BufferedTile_*>_>_>
         *)0x1a1d76);
  anon_unknown_5::TileCoord::TileCoord((TileCoord *)(in_RDI + 0x2c),0,0,0,0);
  in_RDI[0x2e].x = -NAN;
  std::max<int>((int *)&stack0xffffffffffffffd8,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::resize((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            *)this_00,(size_type)pVVar1);
  return;
}

Assistant:

TiledOutputFile::Data::Data (int numThreads):
    multipart(false),
    numXTiles(0),
    numYTiles(0),
    tileOffsetsPosition (0),
    partNumber(-1)
{
    //
    // We need at least one tileBuffer, but if threading is used,
    // to keep n threads busy we need 2*n tileBuffers
    //

    tileBuffers.resize (max (1, 2 * numThreads));
}